

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

int Lf_ObjCoArrival2_rec(Lf_Man_t *p,Gia_Obj_t *pDriver)

{
  Gia_Man_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Lf_Bst_t *pLVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  while( true ) {
    uVar5 = (uint)((ulong)*(undefined8 *)pDriver >> 0x20);
    uVar7 = uVar5 & 0x1fffffff;
    uVar6 = (uint)*(undefined8 *)pDriver;
    if ((((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) ||
       ((uVar6 & 0x1fffffff) != uVar7)) break;
    pDriver = pDriver + -(ulong)(uVar6 & 0x1fffffff);
  }
  if ((uVar6 & 0x1fffffff) == 0x1fffffff || (int)uVar6 < 0) {
    iVar4 = 0;
    if ((~uVar6 & 0x9fffffff) == 0) {
      if (-1 < (int)uVar6) {
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
      }
      if ((p->vCiArrivals).nSize <= (int)uVar7) goto LAB_00709be3;
      iVar4 = (p->vCiArrivals).pArray[uVar5 & 0x1fffffff];
    }
  }
  else {
    pGVar1 = p->pGia;
    pGVar2 = pGVar1->pObjs;
    if ((pDriver < pGVar2) || (pGVar2 + pGVar1->nObjs <= pDriver)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar5 = (int)((long)pDriver - (long)pGVar2 >> 2) * -0x55555555;
    if (((int)uVar5 < 0) || ((p->vOffsets).nSize <= (int)uVar5)) {
LAB_00709be3:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pLVar3 = p->pObjBests;
    iVar4 = (p->vOffsets).pArray[uVar5 & 0x7fffffff];
    uVar6 = 0;
    if (((uint)pLVar3[iVar4].Cut[0] & 1) == 0) {
      uVar6 = 2 - ((uint)pLVar3[iVar4].Cut[1] & 1);
    }
    if ((1 < uVar6) &&
       ((pGVar1->pMuxes == (uint *)0x0 || (pGVar1->pMuxes[uVar5 & 0x7fffffff] == 0)))) {
      __assert_fail("Index < 2 || Gia_ObjIsMux(p->pGia, pDriver)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                    ,0xbe,"int Lf_ObjCoArrival2_rec(Lf_Man_t *, Gia_Obj_t *)");
    }
    iVar4 = pLVar3[iVar4].Delay[uVar6];
  }
  return iVar4;
}

Assistant:

int Lf_ObjCoArrival2_rec( Lf_Man_t * p, Gia_Obj_t * pDriver )
{
    if ( Gia_ObjIsBuf(pDriver) )
        return Lf_ObjCoArrival2_rec( p, Gia_ObjFanin0(pDriver) );
    if ( Gia_ObjIsAnd(pDriver) )
    {
        Lf_Bst_t * pBest = Lf_ObjReadBest(p, Gia_ObjId(p->pGia, pDriver));
        int Index = Lf_BestCutIndex( pBest );
        assert( Index < 2 || Gia_ObjIsMux(p->pGia, pDriver) );
        return pBest->Delay[Index];
    }
    if ( Gia_ObjIsCi(pDriver) )
        return Lf_ObjCiArrival(p, Gia_ObjCioId(pDriver));
    return 0;
}